

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O1

void __thiscall
soplex::SPxAutoPR<double>::load(SPxAutoPR<double> *this,SPxSolverBase<double> *p_solver)

{
  SPxSteepPR<double>::load(&(this->steep).super_SPxSteepPR<double>,p_solver);
  (this->devex).super_SPxPricer<double>.thesolver = p_solver;
  (*(this->devex).super_SPxPricer<double>._vptr_SPxPricer[8])
            (&this->devex,(ulong)(uint)p_solver->theRep);
  (this->super_SPxPricer<double>).thesolver = p_solver;
  (*(this->super_SPxPricer<double>)._vptr_SPxPricer[7])(this,(ulong)(uint)p_solver->theType);
  return;
}

Assistant:

void SPxAutoPR<R>::load(SPxSolverBase<R>* p_solver)
{
   steep.load(p_solver);
   devex.load(p_solver);
   this->thesolver = p_solver;
   setType(p_solver->type());
}